

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.cpp
# Opt level: O3

void cbtCollisionWorld::rayTestSingleInternal
               (cbtTransform *rayFromTrans,cbtTransform *rayToTrans,
               cbtCollisionObjectWrapper *collisionObjectWrap,RayResultCallback *resultCallback)

{
  cbtScalar cVar1;
  float fVar2;
  cbtScalar cVar3;
  undefined8 uVar4;
  cbtCompoundShape *this;
  cbtTransform *this_00;
  cbtCollisionObject *pcVar5;
  cbtCompoundShape *this_01;
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  cbtVector3 cVar15;
  undefined8 uVar16;
  int iVar17;
  undefined4 extraout_var;
  int i;
  cbtGjkConvexCast *pcVar18;
  cbtBvhTriangleMeshShape *triangleMesh;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar43;
  cbtVector3 rayAabbMaxLocal;
  cbtVector3 rayAabbMinLocal;
  cbtVector3 rayToLocal_1;
  cbtVector3 rayToLocalScaled;
  LocalRayResult localRayResult;
  cbtGjkConvexCast gjkConvexCaster;
  cbtSubsimplexConvexCast subSimplexConvexCaster;
  cbtTransform worldTocollisionObject;
  cbtVoronoiSimplexSolver simplexSolver;
  float local_3a8;
  cbtScalar cStack_3a4;
  float fStack_3a0;
  cbtScalar cStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  undefined1 local_388 [16];
  cbtVector3 local_378;
  cbtVector3 local_368;
  cbtVector3 local_358;
  undefined8 local_348;
  undefined8 uStack_340;
  float local_338;
  float local_334;
  uint local_330;
  uint local_328;
  float fStack_324;
  float local_320;
  undefined1 local_318 [2] [16];
  undefined1 local_2f8 [2] [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  cbtVector3 local_2a8;
  uint uStack_298;
  uint uStack_294;
  uint local_290;
  uint local_288;
  float local_284;
  uint local_280;
  undefined8 local_278;
  float local_270;
  ulong local_220;
  float fStack_218;
  undefined4 uStack_214;
  cbtScalar local_200;
  undefined8 local_1f8;
  undefined8 local_1f0;
  undefined4 local_1e8;
  undefined1 local_1e0 [16];
  cbtCompoundShape *local_1d0;
  cbtTransform *local_1c8;
  cbtTransform *local_1c0;
  undefined8 local_1b8;
  RayResultCallback *local_1b0;
  cbtCollisionObject *local_1a8;
  cbtCompoundShape *local_1a0;
  cbtScalar local_198 [4];
  cbtScalar local_188 [2];
  cbtVector3 cStack_180;
  cbtVector3 cStack_170;
  cbtVector3 acStack_160 [11];
  cbtScalar local_ac;
  cbtUsageBitfield local_94 [14];
  cbtConvexInternalShape local_78;
  
  cbtConvexInternalShape::cbtConvexInternalShape(&local_78);
  auVar19._8_4_ = 0x3f800000;
  auVar19._0_8_ = 0x3f8000003f800000;
  auVar19._12_4_ = 0x3f800000;
  local_78.super_cbtConvexShape.super_cbtCollisionShape._vptr_cbtCollisionShape =
       (_func_int **)&PTR__cbtConvexShape_00b4a1b0;
  local_78.super_cbtConvexShape.super_cbtCollisionShape.m_shapeType = 8;
  local_78._28_8_ = vmovlps_avx(auVar19);
  local_78._36_4_ = 0x3f800000;
  local_78._40_4_ = 0;
  local_78.m_implicitShapeDimensions.m_floats[0] = 0.0;
  local_78.m_implicitShapeDimensions.m_floats[1] = 0.0;
  local_78.m_implicitShapeDimensions.m_floats[2] = 0.0;
  local_78.m_implicitShapeDimensions.m_floats[3] = 0.0;
  local_78.m_collisionMargin = 0.0;
  local_78.m_padding = 0.0;
  this = (cbtCompoundShape *)collisionObjectWrap->m_shape;
  this_00 = collisionObjectWrap->m_worldTransform;
  iVar17 = (((cbtTriangleMeshShape *)&this->super_cbtCollisionShape)->super_cbtConcaveShape).
           super_cbtCollisionShape.m_shapeType;
  if (iVar17 < 0x18) {
    local_388._0_8_ = resultCallback;
    local_2a8.m_floats[0] = 1.6576352e-38;
    local_2a8.m_floats[1] = 0.0;
    local_1f8 = 0;
    local_1f0 = 0x2000000000;
    local_1e8 = 0x38d1b717;
    local_200 = resultCallback->m_closestHitFraction;
    local_ac = 0.0001;
    local_94[0]._0_1_ = 0;
    cbtSubsimplexConvexCast::cbtSubsimplexConvexCast
              ((cbtSubsimplexConvexCast *)local_2f8,&local_78.super_cbtConvexShape,
               (cbtConvexShape *)this,(cbtVoronoiSimplexSolver *)local_1e0);
    cbtGjkConvexCast::cbtGjkConvexCast
              ((cbtGjkConvexCast *)local_318,&local_78.super_cbtConvexShape,(cbtConvexShape *)this,
               (cbtVoronoiSimplexSolver *)local_1e0);
    pcVar18 = (cbtGjkConvexCast *)local_318;
    if ((*(byte *)(local_388._0_8_ + 0x20) & 8) == 0) {
      pcVar18 = (cbtGjkConvexCast *)local_2f8;
    }
    iVar17 = (*(((cbtSubsimplexConvexCast *)pcVar18)->super_cbtConvexCast)._vptr_cbtConvexCast[2])
                       (pcVar18,rayFromTrans,rayToTrans,this_00,this_00,&local_2a8);
    if ((char)iVar17 != '\0') {
      auVar20._8_8_ = 0;
      auVar20._0_8_ = local_220;
      fVar7 = (float)local_220;
      auVar23._0_4_ = fVar7 * fVar7;
      fVar43 = (float)(local_220 >> 0x20);
      auVar23._4_4_ = fVar43 * fVar43;
      auVar23._8_8_ = 0;
      auVar19 = vmovshdup_avx(auVar23);
      auVar19 = vfmadd231ss_fma(auVar19,auVar20,auVar20);
      auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)fStack_218),ZEXT416((uint)fStack_218));
      if ((0.0001 < auVar19._0_4_) && (local_200 < *(float *)(local_388._0_8_ + 8))) {
        auVar19 = vsqrtss_avx(auVar19,auVar19);
        fVar27 = 1.0 / auVar19._0_4_;
        auVar21._0_4_ = fVar7 * fVar27;
        auVar21._4_4_ = fVar43 * fVar27;
        auVar21._8_4_ = fVar27 * 0.0;
        auVar21._12_4_ = fVar27 * 0.0;
        local_348 = vmovlps_avx(auVar21);
        fStack_218 = fStack_218 * fVar27;
        uStack_340 = CONCAT44(uStack_214,fStack_218);
        local_358.m_floats[2] = 0.0;
        local_358.m_floats[3] = 0.0;
        local_358.m_floats._0_8_ = collisionObjectWrap->m_collisionObject;
        local_338 = local_200;
        local_220 = local_348;
        (**(code **)(*(long *)local_388._0_8_ + 0x18))(local_388._0_8_,&local_358,1);
      }
    }
    cbtConvexCast::~cbtConvexCast((cbtConvexCast *)local_318);
    cbtConvexCast::~cbtConvexCast((cbtConvexCast *)local_2f8);
  }
  else if (iVar17 - 0x19U < 0xb) {
    cbtTransform::inverse(this_00);
    auVar13._4_4_ = local_2a8.m_floats[2];
    auVar13._8_4_ = local_2a8.m_floats[3];
    auVar13._0_4_ = local_2a8.m_floats[1];
    auVar13._12_4_ = uStack_298;
    fVar7 = (rayFromTrans->m_origin).m_floats[1];
    auVar6._4_4_ = local_2a8.m_floats[1];
    auVar6._0_4_ = local_2a8.m_floats[0];
    auVar6._8_4_ = local_2a8.m_floats[2];
    auVar6._12_4_ = local_2a8.m_floats[3];
    cVar1 = (rayFromTrans->m_origin).m_floats[0];
    auVar33._4_4_ = cVar1;
    auVar33._0_4_ = cVar1;
    auVar33._8_4_ = cVar1;
    auVar33._12_4_ = cVar1;
    auVar14._8_4_ = uStack_298;
    auVar14._0_4_ = local_2a8.m_floats[2];
    auVar14._4_4_ = local_2a8.m_floats[3];
    auVar14._12_4_ = uStack_294;
    cVar1 = (rayFromTrans->m_origin).m_floats[2];
    auVar34._4_4_ = cVar1;
    auVar34._0_4_ = cVar1;
    auVar34._8_4_ = cVar1;
    auVar34._12_4_ = cVar1;
    auVar19 = vinsertps_avx(auVar13,ZEXT416(uStack_294),0x10);
    auVar6 = vinsertps_avx(auVar6,ZEXT416(uStack_298),0x10);
    auVar28 = vinsertps_avx(auVar14,ZEXT416(local_290),0x10);
    auVar32._0_4_ = fVar7 * auVar19._0_4_;
    auVar32._4_4_ = fVar7 * auVar19._4_4_;
    auVar32._8_4_ = fVar7 * auVar19._8_4_;
    auVar32._12_4_ = fVar7 * auVar19._12_4_;
    auVar31 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * local_284)),auVar33,ZEXT416(local_288));
    auVar29 = vfmadd231ps_fma(auVar32,auVar6,auVar33);
    auVar31 = vfmadd231ss_fma(auVar31,auVar34,ZEXT416(local_280));
    auVar29 = vfmadd231ps_fma(auVar29,auVar28,auVar34);
    auVar39._0_4_ = (float)local_278 + auVar29._0_4_;
    fVar43 = (float)((ulong)local_278 >> 0x20);
    auVar39._4_4_ = fVar43 + auVar29._4_4_;
    auVar39._8_4_ = auVar29._8_4_ + 0.0;
    auVar39._12_4_ = auVar29._12_4_ + 0.0;
    auVar31 = ZEXT416((uint)(local_270 + auVar31._0_4_));
    local_2f8[0] = vinsertps_avx(auVar39,auVar31,0x28);
    fVar7 = (rayToTrans->m_origin).m_floats[1];
    cVar1 = (rayToTrans->m_origin).m_floats[0];
    auVar35._4_4_ = cVar1;
    auVar35._0_4_ = cVar1;
    auVar35._8_4_ = cVar1;
    auVar35._12_4_ = cVar1;
    cVar1 = (rayToTrans->m_origin).m_floats[2];
    auVar38._4_4_ = cVar1;
    auVar38._0_4_ = cVar1;
    auVar38._8_4_ = cVar1;
    auVar38._12_4_ = cVar1;
    auVar24._0_4_ = auVar19._0_4_ * fVar7;
    auVar24._4_4_ = auVar19._4_4_ * fVar7;
    auVar24._8_4_ = auVar19._8_4_ * fVar7;
    auVar24._12_4_ = auVar19._12_4_ * fVar7;
    auVar29 = vfmadd231ss_fma(ZEXT416((uint)(local_284 * fVar7)),auVar35,ZEXT416(local_288));
    auVar19 = vfmadd231ps_fma(auVar24,auVar35,auVar6);
    auVar19 = vfmadd231ps_fma(auVar19,auVar38,auVar28);
    auVar6 = vfmadd231ss_fma(auVar29,auVar38,ZEXT416(local_280));
    auVar25._0_4_ = (float)local_278 + auVar19._0_4_;
    auVar25._4_4_ = fVar43 + auVar19._4_4_;
    auVar25._8_4_ = auVar19._8_4_ + 0.0;
    auVar25._12_4_ = auVar19._12_4_ + 0.0;
    auVar19 = ZEXT416((uint)(local_270 + auVar6._0_4_));
    local_318[0] = vinsertps_avx(auVar25,auVar19,0x28);
    iVar17 = (((cbtTriangleMeshShape *)&this->super_cbtCollisionShape)->super_cbtConcaveShape).
             super_cbtCollisionShape.m_shapeType;
    if (iVar17 == 0x1a) {
      this_01 = *(cbtCompoundShape **)((cbtVector3 *)&(this->m_children).m_data)->m_floats;
      local_388 = auVar39;
      local_2d8 = auVar19;
      local_2c8 = auVar25;
      local_2b8 = auVar31;
      iVar17 = (*(((cbtTriangleMeshShape *)&this->super_cbtCollisionShape)->super_cbtConcaveShape).
                 super_cbtCollisionShape._vptr_cbtCollisionShape[7])(this);
      fVar7 = *(float *)((ulong *)CONCAT44(extraout_var,iVar17) + 1);
      auVar26._8_8_ = 0;
      auVar26._0_8_ = *(ulong *)CONCAT44(extraout_var,iVar17);
      auVar19 = vdivps_avx(local_388,auVar26);
      auVar30._0_4_ = local_2b8._0_4_ / fVar7;
      auVar30._4_12_ = local_2b8._4_12_;
      local_358.m_floats = (cbtScalar  [4])vinsertps_avx(auVar19,auVar30,0x28);
      auVar19 = vdivps_avx(local_2c8,auVar26);
      auVar22._0_4_ = local_2d8._0_4_ / fVar7;
      auVar22._4_12_ = local_2d8._4_12_;
      local_368.m_floats = (cbtScalar  [4])vinsertps_avx(auVar19,auVar22,0x28);
      pcVar5 = collisionObjectWrap->m_collisionObject;
      cbtTriangleRaycastCallback::cbtTriangleRaycastCallback
                ((cbtTriangleRaycastCallback *)local_1e0,&local_358,&local_368,
                 resultCallback->m_flags);
      local_1e0._0_8_ = &PTR__cbtTriangleCallback_00b47db0;
      local_198._0_8_ = *(undefined8 *)(this_00->m_basis).m_el[0].m_floats;
      local_198[2] = (this_00->m_basis).m_el[0].m_floats[2];
      local_198[3] = (this_00->m_basis).m_el[0].m_floats[3];
      local_188 = *(cbtScalar (*) [2])(this_00->m_basis).m_el[1].m_floats;
      cStack_180.m_floats._0_8_ = *(undefined8 *)((this_00->m_basis).m_el[1].m_floats + 2);
      cStack_180.m_floats._8_8_ = *(undefined8 *)(this_00->m_basis).m_el[2].m_floats;
      cStack_170.m_floats._0_8_ = *(undefined8 *)((this_00->m_basis).m_el[2].m_floats + 2);
      cStack_170.m_floats._8_8_ = *(undefined8 *)(this_00->m_origin).m_floats;
      acStack_160[0].m_floats._0_8_ = *(undefined8 *)((this_00->m_origin).m_floats + 2);
      local_1b8 = (cbtTransform *)
                  CONCAT44(resultCallback->m_closestHitFraction,(cbtScalar)local_1b8);
      local_1b0 = resultCallback;
      local_1a8 = pcVar5;
      local_1a0 = this_01;
      cbtBvhTriangleMeshShape::performRaycast
                ((cbtBvhTriangleMeshShape *)this_01,(cbtTriangleCallback *)local_1e0,&local_358,
                 &local_368);
    }
    else {
      local_1a0 = this;
      if (iVar17 == 0x19) {
        pcVar5 = collisionObjectWrap->m_collisionObject;
        cbtTriangleRaycastCallback::cbtTriangleRaycastCallback
                  ((cbtTriangleRaycastCallback *)local_1e0,(cbtVector3 *)local_2f8,
                   (cbtVector3 *)local_318,resultCallback->m_flags);
        local_1e0._0_8_ = &PTR__cbtTriangleCallback_00b47db0;
        local_198._0_8_ = *(undefined8 *)(this_00->m_basis).m_el[0].m_floats;
        local_198[2] = (this_00->m_basis).m_el[0].m_floats[2];
        local_198[3] = (this_00->m_basis).m_el[0].m_floats[3];
        local_188 = *(cbtScalar (*) [2])(this_00->m_basis).m_el[1].m_floats;
        cStack_180.m_floats._0_8_ = *(undefined8 *)((this_00->m_basis).m_el[1].m_floats + 2);
        cStack_180.m_floats._8_8_ = *(undefined8 *)(this_00->m_basis).m_el[2].m_floats;
        cStack_170.m_floats._0_8_ = *(undefined8 *)((this_00->m_basis).m_el[2].m_floats + 2);
        cStack_170.m_floats._8_8_ = *(undefined8 *)(this_00->m_origin).m_floats;
        acStack_160[0].m_floats._0_8_ = *(undefined8 *)((this_00->m_origin).m_floats + 2);
        local_1b8 = (cbtTransform *)
                    CONCAT44(resultCallback->m_closestHitFraction,(cbtScalar)local_1b8);
        local_1b0 = resultCallback;
        local_1a8 = pcVar5;
        cbtBvhTriangleMeshShape::performRaycast
                  ((cbtBvhTriangleMeshShape *)this,(cbtTriangleCallback *)local_1e0,
                   (cbtVector3 *)local_2f8,(cbtVector3 *)local_318);
      }
      else {
        cbtTransform::inverse(this_00);
        fVar7 = (rayFromTrans->m_origin).m_floats[1];
        cVar1 = (rayFromTrans->m_origin).m_floats[0];
        cVar3 = (rayFromTrans->m_origin).m_floats[2];
        auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * local_358.m_floats[1])),
                                  ZEXT416((uint)cVar1),ZEXT416((uint)local_358.m_floats[0]));
        auVar6 = vfmadd231ss_fma(ZEXT416((uint)(local_348._4_4_ * fVar7)),ZEXT416((uint)cVar1),
                                 ZEXT416((uint)local_348));
        auVar28 = vfmadd231ss_fma(ZEXT416((uint)(local_334 * fVar7)),ZEXT416((uint)local_338),
                                  ZEXT416((uint)cVar1));
        auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)cVar3),ZEXT416((uint)local_358.m_floats[2]))
        ;
        auVar6 = vfmadd231ss_fma(auVar6,ZEXT416((uint)cVar3),ZEXT416((uint)uStack_340));
        auVar28 = vfmadd231ss_fma(auVar28,ZEXT416(local_330),ZEXT416((uint)cVar3));
        auVar19 = vaddss_avx512f(auVar19,ZEXT416(local_328));
        auVar19 = vinsertps_avx(auVar19,ZEXT416((uint)(auVar6._0_4_ + fStack_324)),0x10);
        local_368.m_floats =
             (cbtScalar  [4])vinsertps_avx(auVar19,ZEXT416((uint)(local_320 + auVar28._0_4_)),0x28);
        fVar7 = (rayToTrans->m_origin).m_floats[1];
        cVar1 = (rayToTrans->m_origin).m_floats[0];
        cVar3 = (rayToTrans->m_origin).m_floats[2];
        auVar19 = vfmadd231ss_fma(ZEXT416((uint)(local_358.m_floats[1] * fVar7)),
                                  ZEXT416((uint)cVar1),ZEXT416((uint)local_358.m_floats[0]));
        auVar6 = vfmadd231ss_fma(ZEXT416((uint)(local_348._4_4_ * fVar7)),ZEXT416((uint)cVar1),
                                 ZEXT416((uint)local_348));
        auVar28 = vfmadd231ss_fma(ZEXT416((uint)(local_334 * fVar7)),ZEXT416((uint)cVar1),
                                  ZEXT416((uint)local_338));
        auVar6 = vfmadd231ss_fma(auVar6,ZEXT416((uint)cVar3),ZEXT416((uint)uStack_340));
        auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)cVar3),ZEXT416((uint)local_358.m_floats[2]))
        ;
        auVar28 = vfmadd231ss_fma(auVar28,ZEXT416((uint)cVar3),ZEXT416(local_330));
        auVar19 = vaddss_avx512f(ZEXT416(local_328),auVar19);
        auVar19 = vinsertps_avx(auVar19,ZEXT416((uint)(fStack_324 + auVar6._0_4_)),0x10);
        local_378.m_floats =
             (cbtScalar  [4])vinsertps_avx(auVar19,ZEXT416((uint)(local_320 + auVar28._0_4_)),0x28);
        pcVar5 = collisionObjectWrap->m_collisionObject;
        cbtTriangleRaycastCallback::cbtTriangleRaycastCallback
                  ((cbtTriangleRaycastCallback *)local_1e0,&local_368,&local_378,
                   resultCallback->m_flags);
        cVar15.m_floats = local_368.m_floats;
        local_1e0._0_8_ = &PTR__cbtTriangleCallback_00b47df8;
        local_198._0_8_ = *(undefined8 *)(this_00->m_basis).m_el[0].m_floats;
        local_198[2] = (this_00->m_basis).m_el[0].m_floats[2];
        local_198[3] = (this_00->m_basis).m_el[0].m_floats[3];
        local_188 = *(cbtScalar (*) [2])(this_00->m_basis).m_el[1].m_floats;
        cStack_180.m_floats._0_8_ = *(undefined8 *)((this_00->m_basis).m_el[1].m_floats + 2);
        cStack_180.m_floats._8_8_ = *(undefined8 *)(this_00->m_basis).m_el[2].m_floats;
        cStack_170.m_floats._0_8_ = *(undefined8 *)((this_00->m_basis).m_el[2].m_floats + 2);
        cStack_170.m_floats._8_8_ = *(undefined8 *)(this_00->m_origin).m_floats;
        acStack_160[0].m_floats._0_8_ = *(undefined8 *)((this_00->m_origin).m_floats + 2);
        local_1b8 = (cbtTransform *)
                    CONCAT44(resultCallback->m_closestHitFraction,(cbtScalar)local_1b8);
        local_398 = local_368.m_floats[0];
        fStack_394 = local_368.m_floats[1];
        uVar4 = _local_398;
        fStack_390 = local_368.m_floats[2];
        fStack_38c = local_368.m_floats[3];
        uVar16 = _fStack_390;
        local_398 = cVar15.m_floats[0];
        fVar7 = local_398;
        fStack_394 = cVar15.m_floats[1];
        fVar43 = fStack_394;
        if (local_378.m_floats[0] < local_398) {
          local_398 = local_378.m_floats[0];
          uVar4 = _local_398;
        }
        _local_398 = uVar4;
        if (local_378.m_floats[1] < fStack_394) {
          fStack_394 = local_378.m_floats[1];
        }
        fStack_390 = cVar15.m_floats[2];
        fVar27 = fStack_390;
        fStack_38c = cVar15.m_floats[3];
        fVar2 = fStack_38c;
        if (local_378.m_floats[2] < fStack_390) {
          fStack_390 = local_378.m_floats[2];
          uVar16 = _fStack_390;
        }
        _fStack_390 = uVar16;
        if (local_378.m_floats[3] < fStack_38c) {
          fStack_38c = local_378.m_floats[3];
        }
        local_3a8 = local_368.m_floats[0];
        cStack_3a4 = local_368.m_floats[1];
        fStack_3a0 = local_368.m_floats[2];
        cStack_39c = local_368.m_floats[3];
        if (fVar7 < local_378.m_floats[0]) {
          cStack_3a4 = fVar43;
          local_3a8 = local_378.m_floats[0];
        }
        if (cStack_3a4 < local_378.m_floats[1]) {
          cStack_3a4 = local_378.m_floats[1];
        }
        if (fVar27 < local_378.m_floats[2]) {
          cStack_39c = fVar2;
          fStack_3a0 = local_378.m_floats[2];
        }
        if (cStack_39c < local_378.m_floats[3]) {
          cStack_39c = local_378.m_floats[3];
        }
        local_368.m_floats = cVar15.m_floats;
        local_1b0 = resultCallback;
        local_1a8 = pcVar5;
        (*(((cbtTriangleMeshShape *)&this->super_cbtCollisionShape)->super_cbtConcaveShape).
          super_cbtCollisionShape._vptr_cbtCollisionShape[0x10])
                  (this,local_1e0,&local_398,&local_3a8);
      }
    }
    cbtTriangleCallback::~cbtTriangleCallback((cbtTriangleCallback *)local_1e0);
  }
  else if (iVar17 == 0x25) {
    local_1e0._8_8_ = collisionObjectWrap->m_collisionObject;
    local_1e0._0_8_ = &PTR__ICollide_00b47e40;
    local_1d0 = this;
    local_1c8 = this_00;
    local_1c0 = rayFromTrans;
    local_1b8 = rayToTrans;
    if (this->m_dynamicAabbTree == (cbtDbvt *)0x0) {
      iVar17 = (this->m_children).m_size;
      local_1b0 = resultCallback;
      if (0 < iVar17) {
        i = 0;
        do {
          rayTestSingleInternal::RayTester::ProcessLeaf((RayTester *)local_1e0,i);
          i = i + 1;
        } while (iVar17 != i);
      }
    }
    else {
      fVar7 = (this_00->m_origin).m_floats[1];
      fVar43 = (this_00->m_origin).m_floats[0];
      fVar27 = (this_00->m_basis).m_el[1].m_floats[2];
      uVar4 = *(undefined8 *)(this_00->m_basis).m_el[1].m_floats;
      fVar2 = (this_00->m_origin).m_floats[2];
      auVar37._8_8_ = 0;
      auVar37._0_8_ = *(ulong *)(this_00->m_basis).m_el[0].m_floats;
      auVar40._8_8_ = 0;
      auVar40._0_8_ = *(ulong *)(this_00->m_basis).m_el[2].m_floats;
      fVar10 = (rayFromTrans->m_origin).m_floats[1] - fVar7;
      fVar11 = (rayFromTrans->m_origin).m_floats[0] - fVar43;
      fVar12 = (rayFromTrans->m_origin).m_floats[2] - fVar2;
      auVar42._4_4_ = fVar11;
      auVar42._0_4_ = fVar11;
      auVar42._8_4_ = fVar11;
      auVar42._12_4_ = fVar11;
      fVar8 = (float)uVar4;
      auVar36._0_4_ = fVar10 * fVar8;
      fVar9 = (float)((ulong)uVar4 >> 0x20);
      auVar36._4_4_ = fVar10 * fVar9;
      auVar36._8_4_ = fVar10 * 0.0;
      auVar36._12_4_ = fVar10 * 0.0;
      auVar29 = ZEXT416((uint)(this_00->m_basis).m_el[0].m_floats[2]);
      auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * fVar27)),auVar29,ZEXT416((uint)fVar11));
      auVar19 = vfmadd213ps_fma(auVar42,auVar37,auVar36);
      auVar41._4_4_ = fVar12;
      auVar41._0_4_ = fVar12;
      auVar41._8_4_ = fVar12;
      auVar41._12_4_ = fVar12;
      auVar36 = ZEXT416((uint)(this_00->m_basis).m_el[2].m_floats[2]);
      auVar6 = vfmadd231ss_fma(auVar6,auVar36,ZEXT416((uint)fVar12));
      auVar19 = vfmadd213ps_fma(auVar41,auVar40,auVar19);
      auVar19 = vinsertps_avx(auVar19,auVar6,0x28);
      local_2a8.m_floats[0] = auVar19._0_4_;
      local_2a8.m_floats[1] = auVar19._4_4_;
      local_2a8.m_floats._8_8_ = auVar19._8_8_;
      fVar43 = (rayToTrans->m_origin).m_floats[0] - fVar43;
      fVar7 = (rayToTrans->m_origin).m_floats[1] - fVar7;
      auVar31._4_4_ = fVar43;
      auVar31._0_4_ = fVar43;
      auVar31._8_4_ = fVar43;
      auVar31._12_4_ = fVar43;
      auVar28._0_4_ = fVar8 * fVar7;
      auVar28._4_4_ = fVar9 * fVar7;
      auVar28._8_4_ = fVar7 * 0.0;
      auVar28._12_4_ = fVar7 * 0.0;
      auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar27 * fVar7)),auVar29,ZEXT416((uint)fVar43));
      fVar2 = (rayToTrans->m_origin).m_floats[2] - fVar2;
      auVar19 = vfmadd213ps_fma(auVar31,auVar37,auVar28);
      auVar29._4_4_ = fVar2;
      auVar29._0_4_ = fVar2;
      auVar29._8_4_ = fVar2;
      auVar29._12_4_ = fVar2;
      auVar6 = vfmadd231ss_fma(auVar6,auVar36,ZEXT416((uint)fVar2));
      auVar19 = vfmadd213ps_fma(auVar29,auVar40,auVar19);
      local_358.m_floats = (cbtScalar  [4])vinsertps_avx(auVar19,auVar6,0x28);
      local_1b0 = resultCallback;
      cbtDbvt::rayTest(this->m_dynamicAabbTree->m_root,&local_2a8,&local_358,(ICollide *)local_1e0);
    }
  }
  cbtConvexShape::~cbtConvexShape(&local_78.super_cbtConvexShape);
  return;
}

Assistant:

void cbtCollisionWorld::rayTestSingleInternal(const cbtTransform& rayFromTrans, const cbtTransform& rayToTrans,
											 const cbtCollisionObjectWrapper* collisionObjectWrap,
											 RayResultCallback& resultCallback)
{
	cbtSphereShape pointShape(cbtScalar(0.0));
	pointShape.setMargin(0.f);
	const cbtConvexShape* castShape = &pointShape;
	const cbtCollisionShape* collisionShape = collisionObjectWrap->getCollisionShape();
	const cbtTransform& colObjWorldTransform = collisionObjectWrap->getWorldTransform();

	if (collisionShape->isConvex())
	{
		//		BT_PROFILE("rayTestConvex");
		cbtConvexCast::CastResult castResult;
		castResult.m_fraction = resultCallback.m_closestHitFraction;

		cbtConvexShape* convexShape = (cbtConvexShape*)collisionShape;
		cbtVoronoiSimplexSolver simplexSolver;
		cbtSubsimplexConvexCast subSimplexConvexCaster(castShape, convexShape, &simplexSolver);

		cbtGjkConvexCast gjkConvexCaster(castShape, convexShape, &simplexSolver);

		//cbtContinuousConvexCollision convexCaster(castShape,convexShape,&simplexSolver,0);

		cbtConvexCast* convexCasterPtr = 0;
		//use kF_UseSubSimplexConvexCastRaytest by default
		if (resultCallback.m_flags & cbtTriangleRaycastCallback::kF_UseGjkConvexCastRaytest)
			convexCasterPtr = &gjkConvexCaster;
		else
			convexCasterPtr = &subSimplexConvexCaster;

		cbtConvexCast& convexCaster = *convexCasterPtr;

		if (convexCaster.calcTimeOfImpact(rayFromTrans, rayToTrans, colObjWorldTransform, colObjWorldTransform, castResult))
		{
			//add hit
			if (castResult.m_normal.length2() > cbtScalar(0.0001))
			{
				if (castResult.m_fraction < resultCallback.m_closestHitFraction)
				{
					//todo: figure out what this is about. When is rayFromTest.getBasis() not identity?
#ifdef USE_SUBSIMPLEX_CONVEX_CAST
					//rotate normal into worldspace
					castResult.m_normal = rayFromTrans.getBasis() * castResult.m_normal;
#endif  //USE_SUBSIMPLEX_CONVEX_CAST

					castResult.m_normal.normalize();
					cbtCollisionWorld::LocalRayResult localRayResult(
						collisionObjectWrap->getCollisionObject(),
						0,
						castResult.m_normal,
						castResult.m_fraction);

					bool normalInWorldSpace = true;
					resultCallback.addSingleResult(localRayResult, normalInWorldSpace);
				}
			}
		}
	}
	else
	{
		if (collisionShape->isConcave())
		{
			//ConvexCast::CastResult
			struct BridgeTriangleRaycastCallback : public cbtTriangleRaycastCallback
			{
				cbtCollisionWorld::RayResultCallback* m_resultCallback;
				const cbtCollisionObject* m_collisionObject;
				const cbtConcaveShape* m_triangleMesh;

				cbtTransform m_colObjWorldTransform;

				BridgeTriangleRaycastCallback(const cbtVector3& from, const cbtVector3& to,
											  cbtCollisionWorld::RayResultCallback* resultCallback, const cbtCollisionObject* collisionObject, const cbtConcaveShape* triangleMesh, const cbtTransform& colObjWorldTransform) :  //@BP Mod
																																																							cbtTriangleRaycastCallback(from, to, resultCallback->m_flags),
																																																							m_resultCallback(resultCallback),
																																																							m_collisionObject(collisionObject),
																																																							m_triangleMesh(triangleMesh),
																																																							m_colObjWorldTransform(colObjWorldTransform)
				{
				}

				virtual cbtScalar reportHit(const cbtVector3& hitNormalLocal, cbtScalar hitFraction, int partId, int triangleIndex)
				{
					cbtCollisionWorld::LocalShapeInfo shapeInfo;
					shapeInfo.m_shapePart = partId;
					shapeInfo.m_triangleIndex = triangleIndex;

					cbtVector3 hitNormalWorld = m_colObjWorldTransform.getBasis() * hitNormalLocal;

					cbtCollisionWorld::LocalRayResult rayResult(m_collisionObject,
															   &shapeInfo,
															   hitNormalWorld,
															   hitFraction);

					bool normalInWorldSpace = true;
					return m_resultCallback->addSingleResult(rayResult, normalInWorldSpace);
				}
			};

			cbtTransform worldTocollisionObject = colObjWorldTransform.inverse();
			cbtVector3 rayFromLocal = worldTocollisionObject * rayFromTrans.getOrigin();
			cbtVector3 rayToLocal = worldTocollisionObject * rayToTrans.getOrigin();

			//			BT_PROFILE("rayTestConcave");
			if (collisionShape->getShapeType() == TRIANGLE_MESH_SHAPE_PROXYTYPE)
			{
				///optimized version for cbtBvhTriangleMeshShape
				cbtBvhTriangleMeshShape* triangleMesh = (cbtBvhTriangleMeshShape*)collisionShape;

				BridgeTriangleRaycastCallback rcb(rayFromLocal, rayToLocal, &resultCallback, collisionObjectWrap->getCollisionObject(), triangleMesh, colObjWorldTransform);
				rcb.m_hitFraction = resultCallback.m_closestHitFraction;
				triangleMesh->performRaycast(&rcb, rayFromLocal, rayToLocal);
			}
			else if (collisionShape->getShapeType() == SCALED_TRIANGLE_MESH_SHAPE_PROXYTYPE)
			{
				///optimized version for cbtScaledBvhTriangleMeshShape
				cbtScaledBvhTriangleMeshShape* scaledTriangleMesh = (cbtScaledBvhTriangleMeshShape*)collisionShape;
				cbtBvhTriangleMeshShape* triangleMesh = (cbtBvhTriangleMeshShape*)scaledTriangleMesh->getChildShape();

				//scale the ray positions
				cbtVector3 scale = scaledTriangleMesh->getLocalScaling();
				cbtVector3 rayFromLocalScaled = rayFromLocal / scale;
				cbtVector3 rayToLocalScaled = rayToLocal / scale;

				//perform raycast in the underlying cbtBvhTriangleMeshShape
				BridgeTriangleRaycastCallback rcb(rayFromLocalScaled, rayToLocalScaled, &resultCallback, collisionObjectWrap->getCollisionObject(), triangleMesh, colObjWorldTransform);
				rcb.m_hitFraction = resultCallback.m_closestHitFraction;
				triangleMesh->performRaycast(&rcb, rayFromLocalScaled, rayToLocalScaled);
			}
			else
			{
				//generic (slower) case
				cbtConcaveShape* concaveShape = (cbtConcaveShape*)collisionShape;

				cbtTransform worldTocollisionObject = colObjWorldTransform.inverse();

				cbtVector3 rayFromLocal = worldTocollisionObject * rayFromTrans.getOrigin();
				cbtVector3 rayToLocal = worldTocollisionObject * rayToTrans.getOrigin();

				//ConvexCast::CastResult

				struct BridgeTriangleRaycastCallback : public cbtTriangleRaycastCallback
				{
					cbtCollisionWorld::RayResultCallback* m_resultCallback;
					const cbtCollisionObject* m_collisionObject;
					cbtConcaveShape* m_triangleMesh;

					cbtTransform m_colObjWorldTransform;

					BridgeTriangleRaycastCallback(const cbtVector3& from, const cbtVector3& to,
												  cbtCollisionWorld::RayResultCallback* resultCallback, const cbtCollisionObject* collisionObject, cbtConcaveShape* triangleMesh, const cbtTransform& colObjWorldTransform) :  //@BP Mod
																																																						  cbtTriangleRaycastCallback(from, to, resultCallback->m_flags),
																																																						  m_resultCallback(resultCallback),
																																																						  m_collisionObject(collisionObject),
																																																						  m_triangleMesh(triangleMesh),
																																																						  m_colObjWorldTransform(colObjWorldTransform)
					{
					}

					virtual cbtScalar reportHit(const cbtVector3& hitNormalLocal, cbtScalar hitFraction, int partId, int triangleIndex)
					{
						cbtCollisionWorld::LocalShapeInfo shapeInfo;
						shapeInfo.m_shapePart = partId;
						shapeInfo.m_triangleIndex = triangleIndex;

						cbtVector3 hitNormalWorld = m_colObjWorldTransform.getBasis() * hitNormalLocal;

						cbtCollisionWorld::LocalRayResult rayResult(m_collisionObject,
																   &shapeInfo,
																   hitNormalWorld,
																   hitFraction);

						bool normalInWorldSpace = true;
						return m_resultCallback->addSingleResult(rayResult, normalInWorldSpace);
					}
				};

				BridgeTriangleRaycastCallback rcb(rayFromLocal, rayToLocal, &resultCallback, collisionObjectWrap->getCollisionObject(), concaveShape, colObjWorldTransform);
				rcb.m_hitFraction = resultCallback.m_closestHitFraction;

				cbtVector3 rayAabbMinLocal = rayFromLocal;
				rayAabbMinLocal.setMin(rayToLocal);
				cbtVector3 rayAabbMaxLocal = rayFromLocal;
				rayAabbMaxLocal.setMax(rayToLocal);

				concaveShape->processAllTriangles(&rcb, rayAabbMinLocal, rayAabbMaxLocal);
			}
		}
		else
		{
			//			BT_PROFILE("rayTestCompound");
			if (collisionShape->isCompound())
			{
				struct LocalInfoAdder2 : public RayResultCallback
				{
					RayResultCallback* m_userCallback;
					int m_i;

					LocalInfoAdder2(int i, RayResultCallback* user)
						: m_userCallback(user), m_i(i)
					{
						m_closestHitFraction = m_userCallback->m_closestHitFraction;
						m_flags = m_userCallback->m_flags;
					}
					virtual bool needsCollision(cbtBroadphaseProxy* p) const
					{
						return m_userCallback->needsCollision(p);
					}

					virtual cbtScalar addSingleResult(cbtCollisionWorld::LocalRayResult& r, bool b)
					{
						cbtCollisionWorld::LocalShapeInfo shapeInfo;
						shapeInfo.m_shapePart = -1;
						shapeInfo.m_triangleIndex = m_i;
						if (r.m_localShapeInfo == NULL)
							r.m_localShapeInfo = &shapeInfo;

						const cbtScalar result = m_userCallback->addSingleResult(r, b);
						m_closestHitFraction = m_userCallback->m_closestHitFraction;
						return result;
					}
				};

				struct RayTester : cbtDbvt::ICollide
				{
					const cbtCollisionObject* m_collisionObject;
					const cbtCompoundShape* m_compoundShape;
					const cbtTransform& m_colObjWorldTransform;
					const cbtTransform& m_rayFromTrans;
					const cbtTransform& m_rayToTrans;
					RayResultCallback& m_resultCallback;

					RayTester(const cbtCollisionObject* collisionObject,
							  const cbtCompoundShape* compoundShape,
							  const cbtTransform& colObjWorldTransform,
							  const cbtTransform& rayFromTrans,
							  const cbtTransform& rayToTrans,
							  RayResultCallback& resultCallback) : m_collisionObject(collisionObject),
																   m_compoundShape(compoundShape),
																   m_colObjWorldTransform(colObjWorldTransform),
																   m_rayFromTrans(rayFromTrans),
																   m_rayToTrans(rayToTrans),
																   m_resultCallback(resultCallback)
					{
					}

					void ProcessLeaf(int i)
					{
						const cbtCollisionShape* childCollisionShape = m_compoundShape->getChildShape(i);
						const cbtTransform& childTrans = m_compoundShape->getChildTransform(i);
						cbtTransform childWorldTrans = m_colObjWorldTransform * childTrans;

						cbtCollisionObjectWrapper tmpOb(0, childCollisionShape, m_collisionObject, childWorldTrans, -1, i);
						// replace collision shape so that callback can determine the triangle

						LocalInfoAdder2 my_cb(i, &m_resultCallback);

						rayTestSingleInternal(
							m_rayFromTrans,
							m_rayToTrans,
							&tmpOb,
							my_cb);
					}

					void Process(const cbtDbvtNode* leaf)
					{
						ProcessLeaf(leaf->dataAsInt);
					}
				};

				const cbtCompoundShape* compoundShape = static_cast<const cbtCompoundShape*>(collisionShape);
				const cbtDbvt* dbvt = compoundShape->getDynamicAabbTree();

				RayTester rayCB(
					collisionObjectWrap->getCollisionObject(),
					compoundShape,
					colObjWorldTransform,
					rayFromTrans,
					rayToTrans,
					resultCallback);
#ifndef DISABLE_DBVT_COMPOUNDSHAPE_RAYCAST_ACCELERATION
				if (dbvt)
				{
					cbtVector3 localRayFrom = colObjWorldTransform.inverseTimes(rayFromTrans).getOrigin();
					cbtVector3 localRayTo = colObjWorldTransform.inverseTimes(rayToTrans).getOrigin();
					cbtDbvt::rayTest(dbvt->m_root, localRayFrom, localRayTo, rayCB);
				}
				else
#endif  //DISABLE_DBVT_COMPOUNDSHAPE_RAYCAST_ACCELERATION
				{
					for (int i = 0, n = compoundShape->getNumChildShapes(); i < n; ++i)
					{
						rayCB.ProcessLeaf(i);
					}
				}
			}
		}
	}
}